

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

int matchreg(match *res,reg *reg,easm_expr *expr,iasctx *ctx)

{
  disisa *pdVar1;
  easm_expr *__s2;
  long lVar2;
  int iVar3;
  size_t sVar4;
  easm_expr *local_80;
  ull local_50;
  ull num;
  char *end;
  char *str;
  iasctx *piStack_30;
  int i;
  iasctx *ctx_local;
  easm_expr *expr_local;
  reg *reg_local;
  match *res_local;
  
  piStack_30 = ctx;
  ctx_local = (iasctx *)expr;
  expr_local = (easm_expr *)reg;
  reg_local = (reg *)res;
  if (reg->specials != (sreg *)0x0) {
    str._4_4_ = 0;
    while (*(int *)(&expr_local->sinsn->str + (long)str._4_4_ * 3) != -1) {
      iVar3 = var_ok(*(int *)((long)&expr_local->sinsn->mods + (long)str._4_4_ * 0x18 + 4),0,
                     piStack_30->varinfo);
      if (iVar3 != 0) {
        switch(*(undefined4 *)(&expr_local->sinsn->mods + (long)str._4_4_ * 3)) {
        case 0:
          if ((*(int *)&ctx_local->isa == 0x11) &&
             (iVar3 = strcmp((char *)ctx_local[2].isa,
                             *(char **)(&expr_local->sinsn->isunk + (long)str._4_4_ * 6)),
             iVar3 == 0)) {
            iVar3 = setbf((match *)reg_local,*(bitfield **)expr_local,
                          (long)*(int *)(&expr_local->sinsn->str + (long)str._4_4_ * 3));
            return iVar3;
          }
          break;
        case 1:
          if ((*(int *)&ctx_local->isa == 0x10) && (ctx_local[1].atoms == (litem **)0x0)) {
            iVar3 = setbf((match *)reg_local,*(bitfield **)expr_local,
                          (long)*(int *)(&expr_local->sinsn->str + (long)str._4_4_ * 3));
            return iVar3;
          }
          break;
        case 2:
          if ((*(int *)&ctx_local->isa == 0x10) && (ctx_local[1].atoms == (litem **)0x1)) {
            iVar3 = setbf((match *)reg_local,*(bitfield **)expr_local,
                          (long)*(int *)(&expr_local->sinsn->str + (long)str._4_4_ * 3));
            return iVar3;
          }
          break;
        case 3:
          if (*(int *)&ctx_local->isa == 0x14) {
            iVar3 = setbf((match *)reg_local,*(bitfield **)expr_local,
                          (long)*(int *)(&expr_local->sinsn->str + (long)str._4_4_ * 3));
            return iVar3;
          }
        }
      }
      str._4_4_ = str._4_4_ + 1;
    }
  }
  if (*(int *)&ctx_local->isa == 0x11) {
    pdVar1 = ctx_local[2].isa;
    __s2 = expr_local->e1;
    sVar4 = strlen((char *)expr_local->e1);
    iVar3 = strncmp((char *)pdVar1,(char *)__s2,sVar4);
    if (iVar3 == 0) {
      pdVar1 = ctx_local[2].isa;
      sVar4 = strlen((char *)expr_local->e1);
      end = (char *)((long)&pdVar1->troot + sVar4);
      local_50 = strtoull(end,(char **)&num,10);
      if (*(int *)((long)&expr_local->swizzles + 4) == 0) {
        if (expr_local->e2 == (easm_expr *)0x0) {
          local_80 = (easm_expr *)0x24f1dd;
        }
        else {
          local_80 = expr_local->e2;
        }
        iVar3 = strcmp((char *)num,(char *)local_80);
        if (iVar3 != 0) {
          return 0;
        }
      }
      else {
        sVar4 = strlen((char *)num);
        if (sVar4 != 1) {
          return 0;
        }
        if ((*(char *)num != 'h') && (*(char *)num != 'l')) {
          return 0;
        }
        local_50 = local_50 << 1;
        if (*(char *)num == 'h') {
          local_50 = local_50 | 1;
        }
      }
      lVar2._0_4_ = expr_local->type;
      lVar2._4_4_ = expr_local->special;
      if (lVar2 == 0) {
        res_local._4_4_ = (uint)((local_50 != 0 ^ 0xffU) & 1);
      }
      else {
        res_local._4_4_ = setbf((match *)reg_local,*(bitfield **)expr_local,local_50);
      }
    }
    else {
      res_local._4_4_ = 0;
    }
  }
  else {
    res_local._4_4_ = 0;
  }
  return res_local._4_4_;
}

Assistant:

int matchreg (struct match *res, const struct reg *reg, const struct easm_expr *expr, struct iasctx *ctx) {
	if (reg->specials) {
		int i = 0;
		for (i = 0; reg->specials[i].num != -1; i++) {
			if (!var_ok(reg->specials[i].fmask, 0, ctx->varinfo))
				continue;
			switch (reg->specials[i].mode) {
				case SR_NAMED:
					if (expr->type == EASM_EXPR_REG && !strcmp(expr->str, reg->specials[i].name))
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_ZERO:
					if (expr->type == EASM_EXPR_NUM && expr->num == 0)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_ONE:
					if (expr->type == EASM_EXPR_NUM && expr->num == 1)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_DISCARD:
					if (expr->type == EASM_EXPR_DISCARD)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
			}
		}
	}
	if (expr->type != EASM_EXPR_REG)
		return 0;
	if (strncmp(expr->str, reg->name, strlen(reg->name)))
		return 0;
	const char *str = expr->str + strlen(reg->name);
	char *end;
	ull num = strtoull(str, &end, 10);
	if (!reg->hilo) {
		if (strcmp(end, (reg->suffix?reg->suffix:"")))
			return 0;
	} else {
		if (strlen(end) != 1)
			return 0;
		if (*end != 'h' && *end != 'l')
			return 0;
		num <<= 1;
		if (*end == 'h')
			num |= 1;
	}
	if (reg->bf)
		return setbf(res, reg->bf, num);
	else
		return !num;
}